

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm2d.c
# Opt level: O2

void inv_txfm2d_add_facade
               (int32_t *input,uint16_t *output,int stride,int32_t *txfm_buf,TX_TYPE tx_type,
               TX_SIZE tx_size,int bd)

{
  int32_t *piVar1;
  uint size;
  char cVar2;
  uint16_t uVar3;
  int iVar4;
  TxfmFunc p_Var5;
  long lVar6;
  int *piVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  uint size_00;
  long lVar11;
  uint16_t *puVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  int32_t *piVar17;
  int iVar18;
  bool bVar19;
  int8_t local_88 [12];
  int8_t stage_range_row [12];
  TXFM_2D_FLIP_CFG cfg;
  
  av1_get_inv_txfm_cfg(tx_type,tx_size,&cfg);
  size_00 = tx_size_wide[cfg.tx_size];
  lVar11 = (long)(int)size_00;
  size = tx_size_high[cfg.tx_size];
  iVar18 = 0;
  if (size_00 == size) goto LAB_0088f60c;
  if ((int)size < (int)size_00) {
    if (size * 2 == size_00) {
      iVar18 = 1;
      goto LAB_0088f60c;
    }
    if (size * 4 == size_00) {
      iVar18 = 2;
      goto LAB_0088f60c;
    }
  }
  else {
    if (size_00 * 2 == size) {
      iVar18 = -1;
      goto LAB_0088f60c;
    }
    if (size_00 * 4 == size) {
      iVar18 = -2;
      goto LAB_0088f60c;
    }
  }
  iVar18 = 0;
LAB_0088f60c:
  av1_gen_inv_stage_range(local_88,stage_range_row,&cfg,'\0',bd);
  p_Var5 = inv_txfm_type_to_func(cfg.txfm_type_row);
  uVar15 = size_00;
  if ((int)size_00 < (int)size) {
    uVar15 = size;
  }
  lVar6 = (long)(int)uVar15;
  piVar1 = txfm_buf + lVar6;
  piVar17 = piVar1 + lVar6;
  iVar4 = -iVar18;
  if (0 < iVar18) {
    iVar4 = iVar18;
  }
  uVar13 = 0;
  if (0 < (int)size_00) {
    uVar13 = (ulong)size_00;
  }
  uVar14 = 0;
  if (0 < (int)size) {
    uVar14 = (ulong)size;
  }
  for (uVar16 = 0; uVar16 != uVar14; uVar16 = uVar16 + 1) {
    if (iVar4 == 1) {
      piVar7 = input;
      for (uVar10 = 0; uVar13 != uVar10; uVar10 = uVar10 + 1) {
        txfm_buf[uVar10] = (int32_t)((long)*piVar7 * 0xb50 + 0x800U >> 0xc);
        piVar7 = piVar7 + (int)size;
      }
    }
    else {
      piVar7 = input;
      for (uVar10 = 0; uVar13 != uVar10; uVar10 = uVar10 + 1) {
        txfm_buf[uVar10] = *piVar7;
        piVar7 = piVar7 + (int)size;
      }
    }
    clamp_buf(txfm_buf,size_00,(char)bd + '\b');
    (*p_Var5)(txfm_buf,piVar17,cfg.cos_bit_row,stage_range_row);
    (*av1_round_shift_array)(piVar17,size_00,-(int)*cfg.shift);
    piVar17 = piVar17 + lVar11;
    input = input + 1;
  }
  p_Var5 = inv_txfm_type_to_func(cfg.txfm_type_col);
  cVar2 = '\n';
  if (10 < bd) {
    cVar2 = (char)bd;
  }
  lVar9 = lVar6 * 2;
  for (uVar16 = 0; size_00 = size_00 - 1, uVar16 != uVar13; uVar16 = uVar16 + 1) {
    if (cfg.lr_flip == 0) {
      lVar8 = lVar9;
      for (uVar10 = 0; uVar14 != uVar10; uVar10 = uVar10 + 1) {
        txfm_buf[uVar10] = txfm_buf[lVar8];
        lVar8 = lVar8 + lVar11;
      }
    }
    else {
      lVar8 = (long)(int)size_00 + lVar6 * 2;
      for (uVar10 = 0; uVar14 != uVar10; uVar10 = uVar10 + 1) {
        txfm_buf[uVar10] = txfm_buf[lVar8];
        lVar8 = lVar8 + lVar11;
      }
    }
    clamp_buf(txfm_buf,size,cVar2 + '\x06');
    (*p_Var5)(txfm_buf,piVar1,cfg.cos_bit_col,local_88);
    (*av1_round_shift_array)(piVar1,size,-(int)cfg.shift[1]);
    puVar12 = output;
    uVar10 = uVar14;
    uVar15 = size;
    if (cfg.ud_flip == 0) {
      for (uVar10 = 0; uVar14 != uVar10; uVar10 = uVar10 + 1) {
        uVar3 = highbd_clip_pixel_add(*puVar12,(long)piVar1[uVar10],bd);
        *puVar12 = uVar3;
        puVar12 = puVar12 + stride;
      }
    }
    else {
      while( true ) {
        uVar15 = uVar15 - 1;
        bVar19 = uVar10 == 0;
        uVar10 = uVar10 - 1;
        if (bVar19) break;
        uVar3 = highbd_clip_pixel_add(*puVar12,(long)piVar1[(int)uVar15],bd);
        *puVar12 = uVar3;
        puVar12 = puVar12 + stride;
      }
    }
    lVar9 = lVar9 + 1;
    output = output + 1;
  }
  return;
}

Assistant:

static inline void inv_txfm2d_add_facade(const int32_t *input, uint16_t *output,
                                         int stride, int32_t *txfm_buf,
                                         TX_TYPE tx_type, TX_SIZE tx_size,
                                         int bd) {
  TXFM_2D_FLIP_CFG cfg;
  av1_get_inv_txfm_cfg(tx_type, tx_size, &cfg);
  // Forward shift sum uses larger square size, to be consistent with what
  // av1_gen_inv_stage_range() does for inverse shifts.
  inv_txfm2d_add_c(input, output, stride, &cfg, txfm_buf, tx_size, bd);
}